

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ClassExp(SQCompiler *this)

{
  SQFuncState *pSVar1;
  SQInteger SVar2;
  long local_20;
  SQInteger attrs;
  SQInteger base;
  SQCompiler *this_local;
  
  attrs = -1;
  local_20 = -1;
  if (this->_token == 0x134) {
    Lex(this);
    Expression(this);
    attrs = SQFuncState::TopTarget(this->_fs);
  }
  if (this->_token == 0x140) {
    Lex(this);
    pSVar1 = this->_fs;
    SVar2 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(pSVar1,_OP_NEWOBJ,SVar2,0,0,0);
    ParseTableOrClass(this,0x2c,0x141);
    local_20 = SQFuncState::TopTarget(this->_fs);
  }
  Expect(this,0x7b);
  if (local_20 != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  if (attrs != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  pSVar1 = this->_fs;
  SVar2 = SQFuncState::PushTarget(this->_fs,-1);
  SQFuncState::AddInstruction(pSVar1,_OP_NEWOBJ,SVar2,attrs,local_20,2);
  ParseTableOrClass(this,0x3b,0x7d);
  return;
}

Assistant:

void ClassExp()
    {
        SQInteger base = -1;
        SQInteger attrs = -1;
        if(_token == TK_EXTENDS) {
            Lex(); Expression();
            base = _fs->TopTarget();
        }
        if(_token == TK_ATTR_OPEN) {
            Lex();
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            ParseTableOrClass(_SC(','),TK_ATTR_CLOSE);
            attrs = _fs->TopTarget();
        }
        Expect(_SC('{'));
        if(attrs != -1) _fs->PopTarget();
        if(base != -1) _fs->PopTarget();
        _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), base, attrs,NOT_CLASS);
        ParseTableOrClass(_SC(';'),_SC('}'));
    }